

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCofactorPermConfig(word *pTruth,int i,int nWords,int fSwapOnly,int fNaive)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  uint *pLimitU;
  byte bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint *pTruthU;
  uint uVar11;
  word *pwVar12;
  word *pwVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  
  if (nWords == 1) {
    iVar5 = Abc_Tt6CofactorPermNaive(pTruth,i,fSwapOnly);
    return iVar5;
  }
  if (fNaive != 0) {
    iVar5 = Abc_TtCofactorPermNaive(pTruth,i,nWords,fSwapOnly);
    return iVar5;
  }
  bVar7 = (byte)i;
  if (fSwapOnly != 0) {
    iVar5 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
    if (-1 < iVar5) {
      return 0;
    }
    if (i < 5) {
      if (0 < nWords) {
        uVar10 = s_PMasks[i][0];
        uVar15 = s_PMasks[i][1];
        uVar2 = s_PMasks[i][2];
        uVar14 = 0;
        do {
          uVar3 = pTruth[uVar14];
          bVar8 = (byte)(1 << (bVar7 & 0x1f));
          pTruth[uVar14] =
               (uVar3 & uVar2) >> (bVar8 & 0x3f) |
               (uVar3 & uVar15) << (bVar8 & 0x3f) | uVar3 & uVar10;
          uVar14 = uVar14 + 1;
        } while ((uint)nWords != uVar14);
        return 4;
      }
      return 4;
    }
    pwVar1 = pTruth + nWords;
    if (i != 5) {
      if (0 < nWords) {
        uVar10 = (ulong)(uint)(1 << (bVar7 - 6 & 0x1f));
        if ((uint)i < 7) {
          uVar10 = 1;
        }
        iVar5 = (int)uVar10;
        iVar9 = iVar5 * 4;
        pwVar12 = pTruth + (uint)(iVar5 * 2);
        pwVar13 = pTruth + uVar10;
        do {
          if (0 < iVar5) {
            uVar15 = 0;
            do {
              wVar4 = pwVar13[uVar15];
              pwVar13[uVar15] = pwVar12[uVar15];
              pwVar12[uVar15] = wVar4;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          pTruth = pTruth + iVar9;
          pwVar12 = pwVar12 + iVar9;
          pwVar13 = pwVar13 + iVar9;
        } while (pTruth < pwVar1);
        return 4;
      }
      return 4;
    }
    if (0 < nWords) {
      do {
        *(ulong *)((long)pTruth + 4) =
             CONCAT44((int)*(undefined8 *)((long)pTruth + 4),
                      (int)((ulong)*(undefined8 *)((long)pTruth + 4) >> 0x20));
        pTruth = pTruth + 2;
      } while (pTruth < pwVar1);
      return 4;
    }
    return 4;
  }
  iVar9 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,1);
  iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,2,3);
  iVar5 = i;
  if (iVar6 < 0) {
    if (iVar9 < 0) {
      iVar9 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
      if (iVar9 == 0) {
        uVar11 = 1;
        uVar16 = 3;
        iVar5 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
        Abc_TtFlip(pTruth,nWords,i);
        goto joined_r0x005040dc;
      }
      uVar16 = 1;
      if (iVar9 == -1) goto LAB_0050408a;
    }
    else {
      uVar16 = 1;
      iVar6 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
      if (iVar6 < 1) {
        if (iVar6 == 0) {
LAB_0050408a:
          Abc_TtFlip(pTruth,nWords,i);
          uVar16 = 3;
          iVar5 = i + 1;
        }
        else {
          Abc_TtFlip(pTruth,nWords,i + 1);
          uVar11 = 2;
          if (iVar9 != 0) goto LAB_005040f0;
          uVar16 = 3;
        }
      }
    }
  }
  else if (iVar9 < 0) {
    uVar11 = 0;
    iVar9 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,3);
    if (iVar9 < 0) goto LAB_0050408a;
    if (iVar6 != 0) goto LAB_005040f0;
    uVar16 = 1;
  }
  else {
    iVar5 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
    if (iVar5 < 0) {
      uVar16 = 2;
      iVar5 = i + 1;
    }
    else {
      uVar11 = 0;
      if (iVar5 != 0) goto LAB_005040f0;
      uVar11 = 0;
      uVar16 = 2;
      iVar5 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
joined_r0x005040dc:
      if (-1 < iVar5) goto LAB_005040f0;
      iVar5 = i + 1;
    }
  }
  Abc_TtFlip(pTruth,nWords,iVar5);
  uVar11 = uVar16;
LAB_005040f0:
  iVar5 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
  if (iVar5 < 0) {
    if (i < 5) {
      if (0 < nWords) {
        uVar10 = s_PMasks[i][0];
        uVar15 = s_PMasks[i][1];
        uVar2 = s_PMasks[i][2];
        uVar14 = 0;
        do {
          uVar3 = pTruth[uVar14];
          bVar8 = (byte)(1 << (bVar7 & 0x1f));
          pTruth[uVar14] =
               (uVar3 & uVar2) >> (bVar8 & 0x3f) |
               (uVar3 & uVar15) << (bVar8 & 0x3f) | uVar3 & uVar10;
          uVar14 = uVar14 + 1;
        } while ((uint)nWords != uVar14);
      }
    }
    else {
      pwVar1 = pTruth + nWords;
      if (i == 5) {
        if (0 < nWords) {
          do {
            *(ulong *)((long)pTruth + 4) =
                 CONCAT44((int)*(undefined8 *)((long)pTruth + 4),
                          (int)((ulong)*(undefined8 *)((long)pTruth + 4) >> 0x20));
            pTruth = pTruth + 2;
          } while (pTruth < pwVar1);
        }
      }
      else if (0 < nWords) {
        uVar10 = (ulong)(uint)(1 << (bVar7 - 6 & 0x1f));
        if ((uint)i < 7) {
          uVar10 = 1;
        }
        iVar5 = (int)uVar10;
        iVar9 = iVar5 * 4;
        pwVar12 = pTruth + (uint)(iVar5 * 2);
        pwVar13 = pTruth + uVar10;
        do {
          if (0 < iVar5) {
            uVar15 = 0;
            do {
              wVar4 = pwVar13[uVar15];
              pwVar13[uVar15] = pwVar12[uVar15];
              pwVar12[uVar15] = wVar4;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          pTruth = pTruth + iVar9;
          pwVar12 = pwVar12 + iVar9;
          pwVar13 = pwVar13 + iVar9;
        } while (pTruth < pwVar1);
      }
    }
    uVar11 = uVar11 | 4;
  }
  return uVar11;
}

Assistant:

int Abc_TtCofactorPermConfig( word * pTruth, int i, int nWords, int fSwapOnly, int fNaive )
{
    if ( nWords == 1 )
        return Abc_Tt6CofactorPermNaive( pTruth, i, fSwapOnly );
    if ( fNaive )
        return Abc_TtCofactorPermNaive( pTruth, i, nWords, fSwapOnly );
    if ( fSwapOnly )
    {
        if ( Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 ) < 0 ) // Cof1 < Cof2
        {
            Abc_TtSwapAdjacent( pTruth, nWords, i );
            return 4;
        }
        return 0;
    }
    {  
        int fComp01, fComp02, fComp03, fComp12, fComp13, fComp23, Config = 0;
        fComp01 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 1 );
        fComp23 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 2, 3 );
        if ( fComp23 >= 0 ) // Cof2 >= Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                if ( fComp13 < 0 ) // Cof1 < Cof3 
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                else if ( fComp13 == 0 ) // Cof1 == Cof3 
                {
                    fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                    if ( fComp02 < 0 )
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                }
                // else   Cof1 > Cof3 -- do nothing
            }
            else // Cof0 < Cof1
            {
                fComp03 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 3 );
                if ( fComp03 < 0 ) // Cof0 < Cof3
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else //  Cof0 >= Cof3
                {
                    if ( fComp23 == 0 ) // can flip Cof0 and Cof1
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                }
            }
        }
        else // Cof2 < Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
                if ( fComp12 > 0 ) // Cof1 > Cof2 
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                else if ( fComp12 == 0 ) // Cof1 == Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else // Cof1 < Cof2
                {
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                    if ( fComp01 == 0 )
                        Abc_TtFlip( pTruth, nWords, i ), Config ^= 1;
                }
            }
            else // Cof0 < Cof1
            {
                fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                if ( fComp02 == -1 ) // Cof0 < Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else if ( fComp02 == 0 ) // Cof0 == Cof2
                {
                    fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                    if ( fComp13 >= 0 ) // Cof1 >= Cof3 
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                    else // Cof1 < Cof3 
                    {
                        Abc_TtFlip( pTruth, nWords, i );
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                    }
                }
                else // Cof0 > Cof2
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
            }
        }
        // perform final swap if needed
        fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
        if ( fComp12 < 0 ) // Cof1 < Cof2
            Abc_TtSwapAdjacent( pTruth, nWords, i ), Config ^= 4;
        return Config;
    }
}